

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O1

GLuint __thiscall
Outputs::Display::OpenGL::Shader::compile_shader(Shader *this,string *source,GLenum type)

{
  GLuint GVar1;
  int iVar2;
  uint *puVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  GLint logLength;
  GLint isCompiled;
  vector<char,_std::allocator<char>_> log;
  char *c_str;
  allocator_type local_41;
  int local_40;
  int local_3c;
  pointer local_38;
  pointer local_20;
  
  GVar1 = glCreateShader(type);
  local_20 = (pointer)(source->_M_dataplus)._M_p;
  glShaderSource(GVar1,1,&stack0xffffffffffffffe0,0);
  iVar2 = glGetError();
  if (iVar2 == 0) {
    glCompileShader(GVar1);
    iVar2 = glGetError();
    if (iVar2 == 0) {
      local_3c = 0;
      glGetShaderiv(GVar1,0x8b81);
      iVar2 = glGetError();
      if (iVar2 == 0) {
        if (local_3c != 0) {
          return GVar1;
        }
        glGetShaderiv(GVar1,0x8b84,&local_40);
        iVar2 = glGetError();
        if (iVar2 == 0) {
          if ((long)local_40 < 1) {
LAB_003cd4fb:
            puVar3 = (uint *)__cxa_allocate_exception(4);
            *puVar3 = (uint)(type != 0x8b31);
            __cxa_throw(puVar3,&{unnamed_type#1}::typeinfo,0);
          }
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&stack0xffffffffffffffc8,(long)local_40,
                     &local_41);
          glGetShaderInfoLog(GVar1,local_40,&local_40,local_38);
          iVar2 = glGetError();
          if (iVar2 == 0) {
            compile_shader((Shader *)&stack0xffffffffffffffc8);
            goto LAB_003cd4fb;
          }
          switch(iVar2) {
          case 0x500:
            lVar5 = 0xf;
            pcVar6 = "GL_INVALID_ENUM";
            break;
          case 0x501:
            lVar5 = 0x10;
            pcVar6 = "GL_INVALID_VALUE";
            break;
          case 0x502:
            lVar5 = 0x14;
            pcVar6 = "GL_INVALID_OPERATION";
            break;
          default:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            goto LAB_003cd95a;
          case 0x505:
            lVar5 = 0x10;
            pcVar6 = "GL_OUT_OF_MEMORY";
            break;
          case 0x506:
            lVar5 = 0x20;
            pcVar6 = "GL_INVALID_FRAMEBUFFER_OPERATION";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
LAB_003cd95a:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at line ",9);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x24);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                     ,0x6d);
          std::endl<char,std::char_traits<char>>(poVar4);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                        ,0x24,
                        "GLuint Outputs::Display::OpenGL::Shader::compile_shader(const std::string &, GLenum)"
                       );
        }
        switch(iVar2) {
        case 0x500:
          pcVar6 = "GL_INVALID_ENUM";
          lVar5 = 0xf;
          break;
        case 0x501:
          pcVar6 = "GL_INVALID_VALUE";
          goto LAB_003cd8aa;
        case 0x502:
          pcVar6 = "GL_INVALID_OPERATION";
          lVar5 = 0x14;
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          goto LAB_003cd8b4;
        case 0x505:
          pcVar6 = "GL_OUT_OF_MEMORY";
LAB_003cd8aa:
          lVar5 = 0x10;
          break;
        case 0x506:
          pcVar6 = "GL_INVALID_FRAMEBUFFER_OPERATION";
          lVar5 = 0x20;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
LAB_003cd8b4:
        poVar4 = std::operator<<((ostream *)&std::cerr," at line ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x20);
        poVar4 = std::operator<<(poVar4," in ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                                );
        std::endl<char,std::char_traits<char>>(poVar4);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                      ,0x20,
                      "GLuint Outputs::Display::OpenGL::Shader::compile_shader(const std::string &, GLenum)"
                     );
      }
      switch(iVar2) {
      case 0x500:
        pcVar6 = "GL_INVALID_ENUM";
        lVar5 = 0xf;
        break;
      case 0x501:
        pcVar6 = "GL_INVALID_VALUE";
        goto LAB_003cd7f4;
      case 0x502:
        pcVar6 = "GL_INVALID_OPERATION";
        lVar5 = 0x14;
        break;
      default:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        goto LAB_003cd7fe;
      case 0x505:
        pcVar6 = "GL_OUT_OF_MEMORY";
LAB_003cd7f4:
        lVar5 = 0x10;
        break;
      case 0x506:
        pcVar6 = "GL_INVALID_FRAMEBUFFER_OPERATION";
        lVar5 = 0x20;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
LAB_003cd7fe:
      poVar4 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1d);
      poVar4 = std::operator<<(poVar4," in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                    ,0x1d,
                    "GLuint Outputs::Display::OpenGL::Shader::compile_shader(const std::string &, GLenum)"
                   );
    }
    switch(iVar2) {
    case 0x500:
      pcVar6 = "GL_INVALID_ENUM";
      lVar5 = 0xf;
      break;
    case 0x501:
      pcVar6 = "GL_INVALID_VALUE";
      goto LAB_003cd73e;
    case 0x502:
      pcVar6 = "GL_INVALID_OPERATION";
      lVar5 = 0x14;
      break;
    default:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      goto LAB_003cd748;
    case 0x505:
      pcVar6 = "GL_OUT_OF_MEMORY";
LAB_003cd73e:
      lVar5 = 0x10;
      break;
    case 0x506:
      pcVar6 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      lVar5 = 0x20;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
LAB_003cd748:
    poVar4 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x19);
    poVar4 = std::operator<<(poVar4," in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                  ,0x19,
                  "GLuint Outputs::Display::OpenGL::Shader::compile_shader(const std::string &, GLenum)"
                 );
  }
  switch(iVar2) {
  case 0x500:
    pcVar6 = "GL_INVALID_ENUM";
    lVar5 = 0xf;
    break;
  case 0x501:
    pcVar6 = "GL_INVALID_VALUE";
    goto LAB_003cd688;
  case 0x502:
    pcVar6 = "GL_INVALID_OPERATION";
    lVar5 = 0x14;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    goto LAB_003cd692;
  case 0x505:
    pcVar6 = "GL_OUT_OF_MEMORY";
LAB_003cd688:
    lVar5 = 0x10;
    break;
  case 0x506:
    pcVar6 = "GL_INVALID_FRAMEBUFFER_OPERATION";
    lVar5 = 0x20;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
LAB_003cd692:
  poVar4 = std::operator<<((ostream *)&std::cerr," at line ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x18);
  poVar4 = std::operator<<(poVar4," in ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                ,0x18,
                "GLuint Outputs::Display::OpenGL::Shader::compile_shader(const std::string &, GLenum)"
               );
}

Assistant:

GLuint Shader::compile_shader(const std::string &source, GLenum type) {
	GLuint shader = glCreateShader(type);
	const char *c_str = source.c_str();
	test_gl(glShaderSource, shader, 1, &c_str, NULL);
	test_gl(glCompileShader, shader);

	if constexpr (logger.enabled) {
		GLint isCompiled = 0;
		test_gl(glGetShaderiv, shader, GL_COMPILE_STATUS, &isCompiled);
		if(isCompiled == GL_FALSE) {
			GLint logLength;
			test_gl(glGetShaderiv, shader, GL_INFO_LOG_LENGTH, &logLength);
			if(logLength > 0) {
				const auto length = std::vector<GLchar>::size_type(logLength);
				std::vector<GLchar> log(length);
				test_gl(glGetShaderInfoLog, shader, logLength, &logLength, log.data());
				logger.error().append("Compile log: %s", log.data());
			}

			throw (type == GL_VERTEX_SHADER) ? VertexShaderCompilationError : FragmentShaderCompilationError;
		}
	}

	return shader;
}